

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetCurrentFont(ImFont *font)

{
  float fVar1;
  ImFontAtlas *pIVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  float fVar6;
  
  pIVar5 = GImGui;
  if ((font != (ImFont *)0x0) && (pIVar2 = font->ContainerAtlas, pIVar2 != (ImFontAtlas *)0x0)) {
    fVar1 = font->Scale;
    fVar6 = 0.0;
    if (0.0 < fVar1) {
      GImGui->Font = font;
      auVar4 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                          ZEXT416((uint)(fVar1 * (pIVar5->IO).FontGlobalScale * font->FontSize)));
      pIVar5->FontBaseSize = auVar4._0_4_;
      pIVar3 = pIVar5->CurrentWindow;
      if (pIVar3 != (ImGuiWindow *)0x0) {
        fVar6 = auVar4._0_4_ * pIVar3->FontWindowScale;
        if (pIVar3->ParentWindow != (ImGuiWindow *)0x0) {
          fVar6 = fVar6 * pIVar3->ParentWindow->FontWindowScale;
        }
      }
      pIVar5->FontSize = fVar6;
      (pIVar5->DrawListSharedData).TexUvWhitePixel = pIVar2->TexUvWhitePixel;
      (pIVar5->DrawListSharedData).TexUvLines = pIVar2->TexUvLines;
      (pIVar5->DrawListSharedData).Font = font;
      (pIVar5->DrawListSharedData).FontSize = fVar6;
      return;
    }
    __assert_fail("font->Scale > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1917,"void ImGui::SetCurrentFont(ImFont *)");
  }
  __assert_fail("font && font->IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1916,"void ImGui::SetCurrentFont(ImFont *)");
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}